

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currpinf.cpp
# Opt level: O2

int __thiscall
icu_63::CurrencyPluralInfo::clone
          (CurrencyPluralInfo *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CurrencyPluralInfo *this_00;
  
  this_00 = (CurrencyPluralInfo *)UMemory::operator_new((UMemory *)0x28,(size_t)__fn);
  if (this_00 != (CurrencyPluralInfo *)0x0) {
    CurrencyPluralInfo(this_00,this);
    if (this_00->fInternalStatus < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0027bfb9;
    (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
  }
  this_00 = (CurrencyPluralInfo *)0x0;
LAB_0027bfb9:
  return (int)this_00;
}

Assistant:

CurrencyPluralInfo*
CurrencyPluralInfo::clone() const {
    CurrencyPluralInfo* newObj = new CurrencyPluralInfo(*this);
    // Since clone doesn't have a 'status' parameter, the best we can do is return nullptr
    // if the new object was not full constructed properly (an error occurred).
    if (newObj != nullptr && U_FAILURE(newObj->fInternalStatus)) {
        delete newObj;
        newObj = nullptr;
    }
    return newObj;
}